

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Command::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Command *this,PatternList *left)

{
  element_type *peVar1;
  bool bVar2;
  long lVar3;
  string *psVar4;
  value *__args_1;
  pointer psVar5;
  long lVar6;
  long lVar7;
  string local_98;
  value local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  psVar5 = (left->
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)psVar5;
  lVar7 = 0;
  local_50.field_2._M_allocated_capacity = (size_type)this;
  local_50.field_2._8_8_ = __return_storage_ptr__;
  while( true ) {
    if (lVar6 >> 4 == lVar7) {
      return (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *)local_50.field_2._8_8_;
    }
    peVar1 = (psVar5->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (lVar3 = __dynamic_cast(peVar1,&Pattern::typeinfo,&Argument::typeinfo,0), lVar3 != 0)) break;
    lVar7 = lVar7 + 1;
    psVar5 = psVar5 + 1;
  }
  psVar4 = (string *)(**(code **)(*(long *)local_50.field_2._M_allocated_capacity + 0x18))();
  std::__cxx11::string::string((string *)&local_98,psVar4);
  value::value(&local_78,&local_98);
  bVar2 = operator==(&local_78,(value *)(lVar3 + 0x28));
  value::~value(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  if (!bVar2) {
    return (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *)local_50.field_2._8_8_;
  }
  *(long *)local_50.field_2._8_8_ = lVar7;
  __args_1 = (value *)(**(code **)(*(long *)local_50.field_2._M_allocated_capacity + 0x18))();
  local_78.kind = Bool;
  local_78.variant.boolValue = true;
  std::make_shared<docopt::Command,std::__cxx11::string_const&,docopt::value>(&local_50,__args_1);
  std::__shared_ptr<docopt::LeafPattern,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<docopt::LeafPattern,(__gnu_cxx::_Lock_policy)2> *)
             (local_50.field_2._8_8_ + 8),
             (__shared_ptr<docopt::Command,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  value::~value(&local_78);
  return (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *)local_50.field_2._8_8_;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Command::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				if (name() == arg->getValue()) {
					ret.first = i;
					ret.second = std::make_shared<Command>(name(), value{true});
				}
				break;
			}
		}

		return ret;
	}